

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteCnf.c
# Opt level: O0

void Io_WriteCnfOutputPiMapping(FILE *pFile,int incrementVars)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vCiIds;
  Abc_Ntk_t *pNtk;
  int incrementVars_local;
  FILE *pFile_local;
  
  pNtk_00 = s_pNtk;
  p = Abc_NtkGetCiSatVarNums(s_pNtk);
  fprintf((FILE *)pFile,"c PI variable numbers: <PI_name> <SAT_var_number>\n");
  for (local_34 = 0; iVar1 = Abc_NtkCiNum(pNtk_00), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = Abc_NtkCi(pNtk_00,local_34);
    pcVar2 = Abc_ObjName(pObj_00);
    iVar1 = Vec_IntEntry(p,local_34);
    fprintf((FILE *)pFile,"c %s %d\n",pcVar2,(ulong)(iVar1 + (uint)(0 < incrementVars)));
  }
  Vec_IntFree(p);
  return;
}

Assistant:

void Io_WriteCnfOutputPiMapping( FILE * pFile, int incrementVars )
{
    extern Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = s_pNtk;
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Abc_NtkGetCiSatVarNums( pNtk );
    fprintf( pFile, "c PI variable numbers: <PI_name> <SAT_var_number>\n" );
    Abc_NtkForEachCi( pNtk, pObj, i )
        fprintf( pFile, "c %s %d\n", Abc_ObjName(pObj), Vec_IntEntry(vCiIds, i) + (int)(incrementVars > 0) );
    Vec_IntFree( vCiIds );
}